

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>::Resize
          (TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_> *this,int64_t newsize,
          function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *object)

{
  _Invoker_type p_Var1;
  int64_t *piVar2;
  ostream *poVar3;
  long lVar4;
  function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *pfVar5;
  long lVar6;
  long lVar7;
  function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *__s;
  
  if (newsize < 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ostream::flush();
    return;
  }
  lVar7 = this->fNElements;
  if (lVar7 != newsize) {
    if (newsize == 0) {
      __s = (function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)0x0;
    }
    else {
      piVar2 = (int64_t *)operator_new__(-(ulong)((ulong)newsize >> 0x3b != 0) | newsize << 5 | 8);
      *piVar2 = newsize;
      __s = (function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)(piVar2 + 1);
      memset(__s,0,newsize << 5);
    }
    if (newsize <= lVar7) {
      lVar7 = newsize;
    }
    lVar4 = 0;
    lVar6 = lVar7;
    if (lVar7 < 1) {
      lVar7 = lVar4;
      lVar6 = lVar4;
    }
    while (lVar7 != 0) {
      std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>::operator=
                ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
                 ((long)&(__s->super__Function_base)._M_functor + lVar4),
                 (function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
                 ((long)&(this->fStore->super__Function_base)._M_functor + lVar4));
      lVar4 = lVar4 + 0x20;
      lVar7 = lVar7 + -1;
    }
    pfVar5 = __s + lVar6;
    for (; lVar6 < newsize; lVar6 = lVar6 + 1) {
      std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>::operator=(pfVar5,object);
      pfVar5 = pfVar5 + 1;
    }
    pfVar5 = this->fStore;
    if (pfVar5 != (function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)0x0) {
      p_Var1 = pfVar5[-1]._M_invoker;
      if (p_Var1 != (_Invoker_type)0x0) {
        lVar7 = (long)p_Var1 << 5;
        do {
          std::_Function_base::~_Function_base
                    ((_Function_base *)((long)&pfVar5[-1].super__Function_base._M_functor + lVar7));
          lVar7 = lVar7 + -0x20;
        } while (lVar7 != 0);
      }
      operator_delete__(&pfVar5[-1]._M_invoker,(long)p_Var1 << 5 | 8);
    }
    this->fStore = __s;
    this->fNElements = newsize;
    this->fNAlloc = newsize;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}